

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_file.cpp
# Opt level: O3

int main(int nargs,char **args)

{
  pointer pcVar1;
  char cVar2;
  istream *piVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  ulong *puVar7;
  string riga;
  string folderout;
  string f;
  double t;
  double tf;
  double ti;
  string folderin;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nomi;
  istringstream istr;
  ofstream ofi;
  ifstream ifi;
  ulong *local_6c0;
  long local_6b8;
  ulong local_6b0;
  long lStack_6a8;
  char *local_6a0;
  long local_698;
  char local_690 [16];
  undefined1 *local_680 [2];
  undefined1 local_670 [16];
  undefined1 *local_660 [2];
  undefined1 local_650 [16];
  undefined8 local_640;
  long *local_638;
  pointer local_630;
  pointer local_628;
  double local_620;
  double local_618;
  undefined1 *local_610;
  long local_608;
  undefined1 local_600 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f0;
  string local_5d8;
  long *local_5b8;
  long local_5b0;
  long local_5a8;
  long lStack_5a0;
  ios_base local_540 [264];
  long *local_438;
  long local_430;
  long local_428;
  long lStack_420;
  ios_base local_340 [264];
  long local_238 [65];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"dare gli estremi dell\'intervallo: ",0x22);
  piVar3 = std::istream::_M_extract<double>((double *)&std::cin);
  std::istream::_M_extract<double>((double *)piVar3);
  std::__cxx11::string::string((string *)&local_610,args[1],(allocator *)local_238);
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_5d8,local_610,local_610 + local_608);
  NomiFiles(&local_5f0,true,&local_5d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p);
  }
  local_6a0 = local_690;
  std::__cxx11::string::_M_construct<char*>((string *)&local_6a0,local_610,local_610 + local_608);
  std::__cxx11::string::append((char *)&local_6a0);
  MakeFolder(local_6a0);
  local_630 = local_5f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_5f0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_5f0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_638 = _VTT;
    local_640 = __filebuf;
    do {
      local_680[0] = local_670;
      pcVar1 = ((local_5f0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_628 = local_5f0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_680,pcVar1,
                 pcVar1 + (local_5f0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      local_6c0 = &local_6b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6c0,local_610,local_610 + local_608);
      std::__cxx11::string::append((char *)&local_6c0);
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_6c0,(ulong)local_680[0]);
      local_5b8 = &local_5a8;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_5a8 = *plVar6;
        lStack_5a0 = plVar4[3];
      }
      else {
        local_5a8 = *plVar6;
        local_5b8 = (long *)*plVar4;
      }
      local_5b0 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_5b8);
      local_438 = &local_428;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_428 = *plVar6;
        lStack_420 = plVar4[3];
      }
      else {
        local_428 = *plVar6;
        local_438 = (long *)*plVar4;
      }
      local_430 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::ifstream::ifstream((istream *)local_238,(string *)&local_438,_S_in);
      if (local_438 != &local_428) {
        operator_delete(local_438);
      }
      if (local_5b8 != &local_5a8) {
        operator_delete(local_5b8);
      }
      if (local_6c0 != &local_6b0) {
        operator_delete(local_6c0);
      }
      local_660[0] = local_650;
      std::__cxx11::string::_M_construct<char*>((string *)local_660,local_6a0,local_6a0 + local_698)
      ;
      std::__cxx11::string::append((char *)local_660);
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_660,(ulong)local_680[0]);
      local_6c0 = &local_6b0;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar7) {
        local_6b0 = *puVar7;
        lStack_6a8 = plVar4[3];
      }
      else {
        local_6b0 = *puVar7;
        local_6c0 = (ulong *)*plVar4;
      }
      local_6b8 = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_6c0);
      local_5b8 = &local_5a8;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_5a8 = *plVar6;
        lStack_5a0 = plVar4[3];
      }
      else {
        local_5a8 = *plVar6;
        local_5b8 = (long *)*plVar4;
      }
      local_5b0 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::ofstream::ofstream(&local_438,(string *)&local_5b8,_S_out);
      if (local_5b8 != &local_5a8) {
        operator_delete(local_5b8);
      }
      if (local_6c0 != &local_6b0) {
        operator_delete(local_6c0);
      }
      if (local_660[0] != local_650) {
        operator_delete(local_660[0]);
      }
      local_6c0 = &local_6b0;
      local_6b8 = 0;
      local_6b0 = local_6b0 & 0xffffffffffffff00;
      while( true ) {
        cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_6c0,cVar2);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&local_5b8,(string *)&local_6c0,_S_in);
        std::istream::_M_extract<double>((double *)&local_5b8);
        if (local_618 <= (double)local_660[0]) {
          if (local_620 < (double)local_660[0]) {
            std::__cxx11::istringstream::~istringstream((istringstream *)&local_5b8);
            std::ios_base::~ios_base(local_540);
            break;
          }
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_438,(char *)local_6c0,local_6b8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_5b8);
        std::ios_base::~ios_base(local_540);
      }
      std::ifstream::close();
      std::ofstream::close();
      if (local_6c0 != &local_6b0) {
        operator_delete(local_6c0);
      }
      local_438 = local_638;
      *(undefined8 *)((long)&local_438 + local_638[-3]) = local_640;
      std::filebuf::~filebuf((filebuf *)&local_430);
      std::ios_base::~ios_base(local_340);
      std::ifstream::~ifstream((istream *)local_238);
      if (local_680[0] != local_670) {
        operator_delete(local_680[0]);
      }
      local_5f0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_628 + 1;
    } while (local_5f0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != local_630);
  }
  if (local_6a0 != local_690) {
    operator_delete(local_6a0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5f0);
  if (local_610 != local_600) {
    operator_delete(local_610);
  }
  return 0;
}

Assistant:

int main(int nargs, char** args) {
	double ti, tf;
	cout << "dare gli estremi dell'intervallo: "; 
	cin >> ti >> tf;

	string folderin(args[1]);
	auto nomi = NomiFiles(true, folderin);

	string folderout = folderin + "\\crop";
	MakeFolder(folderout.c_str());

	for(string f : nomi) {
		ifstream ifi(folderin + "\\" + f + ".txt");
		ofstream ofi(folderout + "\\" + f + "_crop.txt");
		double t;
		string riga;
		while(getline(ifi, riga)) {
			istringstream istr(riga); istr >> t;
			if(t < ti) continue;
			if(t > tf) break;
			ofi << riga << endl;
		};
		ifi.close();
		ofi.close();
	};
}